

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_gamemtls_lib.cxx
# Opt level: O0

void __thiscall xray_re::xr_gamemtls_lib::load(xr_gamemtls_lib *this,xr_reader *r)

{
  uint32_t uVar1;
  size_t sVar2;
  xr_gamemtl *this_00;
  xr_gamemtlpair *this_01;
  xr_gamemtlpair *local_58;
  xr_gamemtlpair *gamemtlpair;
  xr_reader *pxStack_48;
  uint32_t id_1;
  xr_reader *f_1;
  xr_gamemtl *material;
  xr_reader *pxStack_30;
  uint32_t id;
  xr_reader *f;
  xr_reader *s;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_gamemtls_lib *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar2 = xr_reader::r_chunk<unsigned_short>(r,0x1000,(unsigned_short *)((long)&s + 6));
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                  ,0x5b,"void xray_re::xr_gamemtls_lib::load(xr_reader &)");
  }
  if (s._6_2_ == 1) {
    sVar2 = xr_reader::find_chunk(pxStack_18,0x1001);
    if (sVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                    ,0x5f,"void xray_re::xr_gamemtls_lib::load(xr_reader &)");
    }
    uVar1 = xr_reader::r_u32(pxStack_18);
    this->m_material_index = uVar1;
    uVar1 = xr_reader::r_u32(pxStack_18);
    this->m_material_pair_index = uVar1;
    xr_reader::debug_find_chunk(pxStack_18);
    f = xr_reader::open_chunk(pxStack_18,0x1002);
    if (f != (xr_reader *)0x0) {
      material._4_4_ = 0;
      while( true ) {
        pxStack_30 = xr_reader::open_chunk(f,material._4_4_);
        if (pxStack_30 == (xr_reader *)0x0) break;
        this_00 = (xr_gamemtl *)operator_new(0x78);
        xr_gamemtl::xr_gamemtl(this_00);
        f_1 = (xr_reader *)this_00;
        xr_gamemtl::load(this_00,pxStack_30);
        std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::push_back
                  (&this->m_materials,(value_type *)&f_1);
        xr_reader::close_chunk(f,&stack0xffffffffffffffd0);
        material._4_4_ = material._4_4_ + 1;
      }
      xr_reader::close_chunk(pxStack_18,&f);
    }
    f = xr_reader::open_chunk(pxStack_18,0x1003);
    if (f != (xr_reader *)0x0) {
      gamemtlpair._4_4_ = 0;
      while( true ) {
        pxStack_48 = xr_reader::open_chunk(f,gamemtlpair._4_4_);
        if (pxStack_48 == (xr_reader *)0x0) break;
        this_01 = (xr_gamemtlpair *)operator_new(0xb8);
        xr_gamemtlpair::xr_gamemtlpair(this_01);
        local_58 = this_01;
        xr_gamemtlpair::load(this_01,pxStack_48);
        std::vector<xray_re::xr_gamemtlpair_*,_std::allocator<xray_re::xr_gamemtlpair_*>_>::
        push_back(&this->m_material_pairs,&local_58);
        xr_reader::close_chunk(f,&stack0xffffffffffffffb8);
        gamemtlpair._4_4_ = gamemtlpair._4_4_ + 1;
      }
      xr_reader::close_chunk(pxStack_18,&f);
    }
    return;
  }
  __assert_fail("version == GAMEMTLS_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                ,0x5c,"void xray_re::xr_gamemtls_lib::load(xr_reader &)");
}

Assistant:

void xr_gamemtls_lib::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(GAMEMTLS_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == GAMEMTLS_VERSION);

	if (!r.find_chunk(GAMEMTLS_CHUNK_AUTOINC))
		xr_not_expected();
	m_material_index = r.r_u32();
	m_material_pair_index = r.r_u32();
	r.debug_find_chunk();

	xr_reader* s = r.open_chunk(GAMEMTLS_CHUNK_MATERIALS);
	if (s) {
		xr_reader* f;
		for (uint32_t id = 0; (f = s->open_chunk(id)); ++id) {
			xr_gamemtl* material = new xr_gamemtl;
			material->load(*f);
			m_materials.push_back(material);
			s->close_chunk(f);
		}
		r.close_chunk(s);
	}
	s = r.open_chunk(GAMEMTLS_CHUNK_MATERIAL_PAIRS);
	if (s) {
		xr_reader* f;
		for (uint32_t id = 0; (f = s->open_chunk(id)); ++id) {
			xr_gamemtlpair* gamemtlpair = new xr_gamemtlpair;
			gamemtlpair->load(*f);
			m_material_pairs.push_back(gamemtlpair);
			s->close_chunk(f);
		}
		r.close_chunk(s);
	}
}